

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFExpression.cpp
# Opt level: O3

int __thiscall
llvm::DWARFExpression::verify
          (DWARFExpression *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen
          )

{
  int iVar1;
  uchar *extraout_RDX;
  uchar *sig_00;
  uchar *extraout_RDX_00;
  Operation *Op;
  undefined1 local_a8 [8];
  iterator __end1;
  iterator __begin1;
  
  iterator::iterator((iterator *)(__end1.Op.OperandEndOffsets + 1),this,0);
  iterator::iterator((iterator *)local_a8,this,(this->Data).Data.Length);
  if (((undefined1  [8])__end1.Op.OperandEndOffsets[1] != local_a8) ||
     (iVar1 = (int)CONCAT71((int7)((ulong)this >> 8),1), __begin1.Expr != __end1.Expr)) {
    sig_00 = extraout_RDX;
    do {
      iVar1 = Operation::verify((Operation *)&__begin1.Offset,ctx,sig_00,siglen,tbs,tbslen);
      if ((char)iVar1 == '\0') {
        return iVar1;
      }
      iterator::operator++((iterator *)(__end1.Op.OperandEndOffsets + 1));
      sig_00 = extraout_RDX_00;
    } while (((undefined1  [8])__end1.Op.OperandEndOffsets[1] != local_a8) ||
            (__begin1.Expr != __end1.Expr));
  }
  return iVar1;
}

Assistant:

bool DWARFExpression::verify(DWARFUnit *U) {
  for (auto &Op : *this)
    if (!Op.verify(U))
      return false;

  return true;
}